

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::CanInitializeByZeroing
               (FieldDescriptor *field,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  
  bVar1 = FieldDescriptor::is_repeated(field);
  if ((bVar1) || (((byte)field[1] & 8) != 0)) {
LAB_001aef90:
    return false;
  }
  switch(*(undefined4 *)((long)&FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4)) {
  case 1:
  case 3:
    bVar2 = *(int *)(field + 0x50) == 0;
    break;
  case 2:
  case 4:
    bVar2 = *(long *)(field + 0x50) == 0;
    break;
  case 5:
    bVar1 = *(double *)(field + 0x50) == 0.0;
    goto LAB_001aefcf;
  case 6:
    bVar1 = *(float *)(field + 0x50) == 0.0;
LAB_001aefcf:
    bVar2 = -bVar1 & 1;
    break;
  case 7:
    bVar2 = (byte)field[0x50] ^ 1;
    break;
  case 8:
    lVar3 = google::protobuf::FieldDescriptor::default_value_enum();
    bVar2 = *(int *)(lVar3 + 4) == 0;
    break;
  default:
    goto LAB_001aef90;
  case 10:
    bVar2 = 1;
  }
  return (bool)bVar2;
}

Assistant:

bool CanInitializeByZeroing(const FieldDescriptor* field,
                            const Options& options,
                            MessageSCCAnalyzer* scc_analyzer) {
  static_assert(
      std::numeric_limits<float>::is_iec559 &&
          std::numeric_limits<double>::is_iec559,
      "proto / abseil requires iec559, which has zero initialized floats.");

  if (field->is_repeated() || field->is_extension()) return false;
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_ENUM:
      return field->default_value_enum()->number() == 0;
    case FieldDescriptor::CPPTYPE_INT32:
      return field->default_value_int32() == 0;
    case FieldDescriptor::CPPTYPE_INT64:
      return field->default_value_int64() == 0;
    case FieldDescriptor::CPPTYPE_UINT32:
      return field->default_value_uint32() == 0;
    case FieldDescriptor::CPPTYPE_UINT64:
      return field->default_value_uint64() == 0;
    case FieldDescriptor::CPPTYPE_FLOAT:
      return field->default_value_float() == 0;
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return field->default_value_double() == 0;
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() == false;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return true;
    default:
      return false;
  }
}